

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::RecordCustomTestMeasurements
          (cmCTestTestHandler *this,cmXMLWriter *xml,string *content)

{
  cmCTest *this_00;
  unsigned_long length;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer puVar4;
  pointer output;
  type puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  allocator<char> local_819;
  string local_818;
  size_t local_7f8;
  size_t cc;
  ostringstream ostr;
  allocator<char> local_671;
  string local_670;
  size_t local_650;
  size_t rlen;
  __array encoded_buffer;
  __array file_buffer;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  unsigned_long local_3a0;
  long len;
  undefined1 local_378 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  string *local_150;
  string *filename;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined1 local_e8 [8];
  cmCTestTestMeasurementXMLParser parser;
  string measurement_str;
  string *content_local;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  while (bVar1 = cmsys::RegularExpression::find(&this->SingleTestMeasurementRegex,content), bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&parser.MeasurementType.field_2 + 8),
               &this->SingleTestMeasurementRegex,1);
    cmCTestTestMeasurementXMLParser::cmCTestTestMeasurementXMLParser
              ((cmCTestTestMeasurementXMLParser *)local_e8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmXMLParser::Parse((cmXMLParser *)local_e8,pcVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&parser.CharacterData.field_2 + 8),"CTestMeasurement");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&parser.CharacterData.field_2 + 8),"DartMeasurement"), bVar1
       )) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"NamedMeasurement",&local_119);
      cmXMLWriter::StartElement(xml,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parser.MeasurementName.field_2 + 8));
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parser.ElementName.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Value",(allocator<char> *)((long)&filename + 7));
      cmXMLWriter::Element<std::__cxx11::string>
                (xml,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &parser.super_cmXMLParser.Parser);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)((long)&filename + 7));
      cmXMLWriter::EndElement(xml);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&parser.CharacterData.field_2 + 8),"CTestMeasurementFile");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&parser.CharacterData.field_2 + 8),"DartMeasurementFile"
                                 ), bVar1)) {
        cmCTest::CleanString(&local_170,(string *)&parser.super_cmXMLParser.Parser,0);
        local_150 = &local_170;
        bVar1 = cmsys::SystemTools::FileExists(local_150);
        if (bVar1) {
          local_3a0 = cmsys::SystemTools::FileLength(local_150);
          if (local_3a0 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3c0,"NamedMeasurement",&local_3c1);
            cmXMLWriter::StartElement(xml,&local_3c0);
            std::__cxx11::string::~string((string *)&local_3c0);
            std::allocator<char>::~allocator(&local_3c1);
            cmXMLWriter::Attribute<std::__cxx11::string>
                      (xml,"name",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&parser.ElementName.field_2 + 8));
            cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
            cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0xe0bdce);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3e8,"Value",&local_3e9);
            std::operator+(&local_430,"Image ",local_150);
            std::operator+(&local_410,&local_430," is empty");
            cmXMLWriter::Element<std::__cxx11::string>(xml,&local_3e8,&local_410);
            std::__cxx11::string::~string((string *)&local_410);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::allocator<char>::~allocator(&local_3e9);
            cmXMLWriter::EndElement(xml);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&parser.MeasurementName.field_2 + 8),"file");
            if (bVar1) {
              AttachFile(this,xml,local_150,(string *)((long)&parser.ElementName.field_2 + 8));
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              std::ifstream::ifstream(&file_buffer,pcVar2,_S_in);
              std::make_unique<unsigned_char[]>((size_t)&encoded_buffer);
              puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 (&encoded_buffer);
              std::istream::read((char *)&file_buffer,(long)puVar4);
              std::make_unique<unsigned_char[]>((size_t)&rlen);
              puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 (&encoded_buffer);
              length = local_3a0;
              output = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)&rlen);
              local_650 = cmsysBase64_Encode(puVar4,length,output,1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_670,"NamedMeasurement",&local_671);
              cmXMLWriter::StartElement(xml,&local_670);
              std::__cxx11::string::~string((string *)&local_670);
              std::allocator<char>::~allocator(&local_671);
              cmXMLWriter::Attribute<std::__cxx11::string>
                        (xml,"name",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&parser.ElementName.field_2 + 8));
              cmXMLWriter::Attribute<std::__cxx11::string>
                        (xml,"type",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&parser.MeasurementName.field_2 + 8));
              cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
              for (local_7f8 = 0; local_7f8 < local_650; local_7f8 = local_7f8 + 1) {
                puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                         operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                     *)&rlen,local_7f8);
                std::operator<<((ostream *)&cc,*puVar5);
                if ((local_7f8 % 0x3c == 0) && (local_7f8 != 0)) {
                  std::ostream::operator<<(&cc,std::endl<char,std::char_traits<char>>);
                }
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_818,"Value",&local_819);
              std::__cxx11::ostringstream::str();
              cmXMLWriter::Element<std::__cxx11::string>(xml,&local_818,&local_840);
              std::__cxx11::string::~string((string *)&local_840);
              std::__cxx11::string::~string((string *)&local_818);
              std::allocator<char>::~allocator(&local_819);
              cmXMLWriter::EndElement(xml);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cc);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&rlen
                        );
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        (&encoded_buffer);
              std::ifstream::~ifstream(&file_buffer);
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"NamedMeasurement",&local_191);
          cmXMLWriter::StartElement(xml,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
          cmXMLWriter::Attribute<std::__cxx11::string>
                    (xml,"name",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&parser.ElementName.field_2 + 8));
          cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,"Value",&local_1b9);
          std::operator+(&local_200,"File ",local_150);
          std::operator+(&local_1e0,&local_200," not found");
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_1b8,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          cmXMLWriter::EndElement(xml);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          poVar3 = std::operator<<((ostream *)local_378,"File \"");
          poVar3 = std::operator<<(poVar3,(string *)local_150);
          poVar3 = std::operator<<(poVar3,"\" not found.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this_00 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar2 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(this_00,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x7ec,pcVar2,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&len);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        }
        std::__cxx11::string::~string((string *)&local_170);
      }
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::ReplaceString(content,pcVar2,"");
    cmCTestTestMeasurementXMLParser::~cmCTestTestMeasurementXMLParser
              ((cmCTestTestMeasurementXMLParser *)local_e8);
    std::__cxx11::string::~string((string *)(parser.MeasurementType.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmCTestTestHandler::RecordCustomTestMeasurements(cmXMLWriter& xml,
                                                      std::string content)
{
  while (this->SingleTestMeasurementRegex.find(content)) {
    // Extract regex match from content and parse it as an XML element.
    auto measurement_str = this->SingleTestMeasurementRegex.match(1);
    auto parser = cmCTestTestMeasurementXMLParser();
    parser.Parse(measurement_str.c_str());

    if (parser.ElementName == "CTestMeasurement" ||
        parser.ElementName == "DartMeasurement") {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", parser.MeasurementType);
      xml.Attribute("name", parser.MeasurementName);
      xml.Element("Value", parser.CharacterData);
      xml.EndElement();
    } else if (parser.ElementName == "CTestMeasurementFile" ||
               parser.ElementName == "DartMeasurementFile") {
      const std::string& filename = cmCTest::CleanString(parser.CharacterData);
      if (!cmSystemTools::FileExists(filename)) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", parser.MeasurementName);
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      } else {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          xml.StartElement("NamedMeasurement");
          xml.Attribute("name", parser.MeasurementName);
          xml.Attribute("type", "text/string");
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          if (parser.MeasurementType == "file") {
            // Treat this measurement like an "ATTACHED_FILE" when the type
            // is explicitly "file" (not an image).
            this->AttachFile(xml, filename, parser.MeasurementName);
          } else {
            cmsys::ifstream ifs(filename.c_str(),
                                std::ios::in
#ifdef _WIN32
                                  | std::ios::binary
#endif
            );
            auto file_buffer = cm::make_unique<unsigned char[]>(len + 1);
            ifs.read(reinterpret_cast<char*>(file_buffer.get()), len);
            auto encoded_buffer = cm::make_unique<unsigned char[]>(
              static_cast<int>(static_cast<double>(len) * 1.5 + 5.0));

            size_t rlen = cmsysBase64_Encode(file_buffer.get(), len,
                                             encoded_buffer.get(), 1);

            xml.StartElement("NamedMeasurement");
            xml.Attribute("name", parser.MeasurementName);
            xml.Attribute("type", parser.MeasurementType);
            xml.Attribute("encoding", "base64");
            std::ostringstream ostr;
            for (size_t cc = 0; cc < rlen; cc++) {
              ostr << encoded_buffer[cc];
              if (cc % 60 == 0 && cc) {
                ostr << std::endl;
              }
            }
            xml.Element("Value", ostr.str());
            xml.EndElement(); // NamedMeasurement
          }
        }
      }
    }

    // Remove this element from content.
    cmSystemTools::ReplaceString(content, measurement_str.c_str(), "");
  }
}